

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_function.cpp
# Opt level: O2

void __thiscall
duckdb::TableMacroFunction::TableMacroFunction
          (TableMacroFunction *this,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *query_node)

{
  (this->super_MacroFunction).type = TABLE_MACRO;
  (this->super_MacroFunction).parameters.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MacroFunction).parameters.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MacroFunction).parameters.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MacroFunction).default_parameters._M_h._M_buckets =
       &(this->super_MacroFunction).default_parameters._M_h._M_single_bucket;
  (this->super_MacroFunction).default_parameters._M_h._M_bucket_count = 1;
  (this->super_MacroFunction).default_parameters._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_MacroFunction).default_parameters._M_h._M_element_count = 0;
  (this->super_MacroFunction).default_parameters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_MacroFunction).default_parameters._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_MacroFunction).default_parameters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_MacroFunction)._vptr_MacroFunction = (_func_int **)&PTR__TableMacroFunction_0279a448;
  (this->query_node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
  _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
       (query_node->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (query_node->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  return;
}

Assistant:

MacroFunction::MacroFunction(MacroType type) : type(type) {
}